

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

bool __thiscall ExecutorX86::InitExecution(ExecutorX86 *this)

{
  Linker *pLVar1;
  char *base;
  char *pcVar2;
  RegVmRegister *pRVar3;
  char *pcVar4;
  
  pLVar1 = this->exLinker;
  (this->vmState).callStackTop = (this->vmState).callStackBase;
  this->lastFinalReturn = 0;
  CommonSetLinker(pLVar1);
  base = (this->vmState).dataStackBase;
  pcVar4 = base + (this->exLinker->globalVarSize + 0xf & 0xfffffff0);
  (this->vmState).dataStackTop = pcVar4;
  pcVar2 = (this->vmState).dataStackEnd;
  if (pcVar4 < pcVar2) {
    GC::SetUnmanagableRange(base,(int)pcVar2 - (int)base);
    this->execErrorMessage = (char *)0x0;
    *(undefined8 *)&this->execErrorObject = 0;
    *(undefined8 *)((long)&(this->execErrorObject).ptr + 4) = 0;
    this->callContinue = true;
    pLVar1 = this->exLinker;
    pRVar3 = (this->vmState).regFileArrayBase;
    (this->vmState).regFileLastPtr = pRVar3;
    (this->vmState).regFileLastTop = pRVar3;
    (this->vmState).instAddress = (this->instAddress).data;
    (this->vmState).codeLaunchHeader = this->codeLaunchHeader;
    if ((pLVar1->fullLinkerData).count != 0) {
      nullcJitContextMainDataAddress = (uintptr_t)&(this->vmState).dataStackBase;
      nullcModuleStartAddress = (uintptr_t)this->binCode;
      nullcModuleEndAddress = nullcModuleStartAddress + this->binCodeSize;
    }
  }
  else {
    this->codeRunning = false;
    this->callContinue = false;
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s","ERROR: allocated stack overflow");
    this->execErrorMessage = this->execErrorBuffer;
    (this->execErrorObject).typeID = 0;
    (this->execErrorObject).ptr = (char *)0x0;
  }
  return pcVar4 < pcVar2;
}

Assistant:

bool ExecutorX86::InitExecution()
{
	vmState.callStackTop = vmState.callStackBase;

	lastFinalReturn = 0;

	CommonSetLinker(exLinker);

	vmState.dataStackTop = vmState.dataStackBase + ((exLinker->globalVarSize + 0xf) & ~0xf);

	if(vmState.dataStackTop >= vmState.dataStackEnd)
	{
		Stop("ERROR: allocated stack overflow");
		return false;
	}

	GC::SetUnmanagableRange(vmState.dataStackBase, unsigned(vmState.dataStackEnd - vmState.dataStackBase));

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;

	execErrorFinalReturnDepth = 0;

	callContinue = true;

	vmState.regFileLastPtr = vmState.regFileArrayBase;
	vmState.regFileLastTop = vmState.regFileArrayBase;

	vmState.instAddress = instAddress.data;
	vmState.codeLaunchHeader = codeLaunchHeader;

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(!dcCallVM)
	{
		dcCallVM = dcNewCallVM(4096);
		dcMode(dcCallVM, DC_CALL_C_DEFAULT);
	}
#endif

	if(!exLinker->fullLinkerData.empty())
	{
		nullcModuleStartAddress = uintptr_t(binCode);
		nullcModuleEndAddress = uintptr_t(binCode + binCodeSize);

		nullcJitContextMainDataAddress = uintptr_t(&vmState.dataStackBase);
	}

	return true;
}